

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

ostream * deqp::gles31::bb::operator<<(ostream *stream,BlockLayoutEntry *entry)

{
  ostream *poVar1;
  int *piVar2;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(entry->name)._M_dataplus._M_p,(entry->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," { name = ",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(entry->name)._M_dataplus._M_p,(entry->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", size = ",9);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->size);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", activeVarIndices = [",0x16);
  piVar2 = (entry->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (entry->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      if (piVar2 != (entry->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
      }
      std::ostream::operator<<(stream,*piVar2);
      piVar2 = piVar2 + 1;
    } while (piVar2 != (entry->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"] }",3);
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const BlockLayoutEntry& entry)
{
	stream << entry.name << " { name = " << entry.name
		   << ", size = " << entry.size
		   << ", activeVarIndices = [";

	for (vector<int>::const_iterator i = entry.activeVarIndices.begin(); i != entry.activeVarIndices.end(); i++)
	{
		if (i != entry.activeVarIndices.begin())
			stream << ", ";
		stream << *i;
	}

	stream << "] }";
	return stream;
}